

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

void __thiscall
imrt::EvaluationFunction::undo_last_eval
          (EvaluationFunction *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *plVar1;
  int o_00;
  int k_00;
  long lVar2;
  _List_node_base *p_Var3;
  int o;
  int k;
  _Node *__tmp;
  _List_node_base *p_Var4;
  
  plVar1 = &this->Z_diff;
  p_Var4 = (this->Z_diff).
           super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)plVar1) {
    do {
      o_00 = *(int *)&p_Var4[1]._M_next;
      k_00 = *(int *)((long)&p_Var4[1]._M_next + 4);
      lVar2 = *(long *)&(this->Z).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[o_00].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar2 + (long)k_00 * 8) =
           *(double *)(lVar2 + (long)k_00 * 8) - (double)p_Var4[1]._M_prev;
      update_sorted_voxels(this,w,Zmin,Zmax,o_00,k_00);
      p_Var4 = p_Var4->_M_next;
    } while (p_Var4 != (_List_node_base *)plVar1);
    p_Var4 = (plVar1->
             super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  }
  this->F = this->prev_F;
  while (p_Var4 != (_List_node_base *)plVar1) {
    p_Var3 = p_Var4->_M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var3;
  }
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

void EvaluationFunction::undo_last_eval(vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax){

	for(auto z:Z_diff){
		int o=z.first.first;
		int k=z.first.second;
		Z[o][k]-=z.second;

		double prev_Dok=D[o][k];
		update_sorted_voxels(w, Zmin, Zmax, o, k);
		//update_beamlets_impact(o, k, prev_Dok);
	}
	F=prev_F;
	prev_F=F; Z_diff.clear();
}